

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O3

bool __thiscall libtorrent::aux::session_impl::preemptive_unchoke(session_impl *this)

{
  mutex *pmVar1;
  int iVar2;
  int64_t iVar3;
  int64_t iVar4;
  bool bVar5;
  unique_lock<std::mutex> l;
  unique_lock<std::mutex> local_38;
  
  pmVar1 = &(this->m_settings).m_mutex;
  local_38._M_owns = false;
  local_38._M_device = pmVar1;
  ::std::unique_lock<std::mutex>::lock(&local_38);
  local_38._M_owns = true;
  iVar2 = (this->m_settings).m_store.m_ints._M_elems[0x1f];
  ::std::unique_lock<std::mutex>::~unique_lock(&local_38);
  if (iVar2 == 0) {
    iVar3 = counters::operator[](&this->m_stats_counters,0xeb);
    iVar4 = counters::operator[](&this->m_stats_counters,0xfd);
    bVar5 = true;
    if (iVar4 <= iVar3) {
      local_38._M_owns = false;
      local_38._M_device = pmVar1;
      ::std::unique_lock<std::mutex>::lock(&local_38);
      local_38._M_owns = true;
      iVar2 = (this->m_settings).m_store.m_ints._M_elems[0x53];
      ::std::unique_lock<std::mutex>::~unique_lock(&local_38);
      bVar5 = SUB41((uint)iVar2 >> 0x1f,0);
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool session_impl::preemptive_unchoke() const
	{
		if (settings().get_int(settings_pack::choking_algorithm) != settings_pack::fixed_slots_choker) return false;
		return m_stats_counters[counters::num_peers_up_unchoked]
			< m_stats_counters[counters::num_unchoke_slots]
			|| m_settings.get_int(settings_pack::unchoke_slots_limit) < 0;
	}